

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O3

void trico_compress_double_precision
               (uint32_t *nr_of_compressed_bytes,uint8_t **out,double *input,
               uint32_t number_of_doubles,uint64_t hash1_size_exponent,uint64_t hash2_size_exponent)

{
  double dVar1;
  void *pvVar2;
  void *pvVar3;
  uint8_t **ppuVar4;
  byte *pbVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  uint64_t uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  size_t __nmemb;
  double dVar16;
  ulong uVar17;
  bool bVar18;
  uint64_t bcode [2];
  uint64_t xor2 [2];
  uint64_t xor1 [2];
  uint64_t auStack_d8 [3];
  byte *local_c0;
  ulong local_b8;
  size_t local_b0;
  size_t local_a8;
  ulong local_a0;
  void *local_98;
  void *local_90;
  uint32_t *local_88;
  uint8_t **local_80;
  long local_78;
  long local_70;
  ulong local_68;
  double local_60;
  uint64_t local_58 [5];
  
  uVar17 = hash1_size_exponent & 0xfffffffffffffffe;
  uVar14 = hash2_size_exponent & 0xfffffffffffffffe;
  if (0x1d < uVar17) {
    uVar17 = 0x1e;
  }
  if (0x1d < uVar14) {
    uVar14 = 0x1e;
  }
  local_88 = nr_of_compressed_bytes;
  pbVar5 = (byte *)malloc((ulong)((number_of_doubles & 1) +
                                 (number_of_doubles >> 1) + number_of_doubles * 8));
  *out = pbVar5;
  local_b0 = 1L << ((byte)uVar17 & 0x3f);
  __nmemb = 1L << ((byte)uVar14 & 0x3f);
  local_80 = out;
  local_90 = calloc(local_b0,8);
  local_a8 = __nmemb;
  local_98 = calloc(__nmemb,8);
  local_68 = uVar14 >> 1 & 0x7fffffff;
  *pbVar5 = (byte)uVar17 * '\b' | (byte)local_68;
  pbVar5[1] = (byte)(number_of_doubles >> 0x18);
  pbVar5[2] = (byte)(number_of_doubles >> 0x10);
  pbVar5[3] = (byte)(number_of_doubles >> 8);
  local_c0 = pbVar5 + 5;
  pbVar5[4] = (byte)number_of_doubles;
  local_b8 = (ulong)number_of_doubles;
  local_a0 = uVar17;
  if (number_of_doubles == 0) {
LAB_0011005e:
    auStack_d8[1] = 1;
    local_58[3] = 0;
    trico_fill_code_double(&local_c0,local_58 + 2,local_58,auStack_d8);
  }
  else {
    local_b0 = local_b0 - 1;
    local_a8 = local_a8 - 1;
    local_78 = 0x40 - uVar17;
    local_70 = 0x40 - uVar14;
    uVar10 = 0;
    lVar13 = 0;
    uVar14 = 0;
    uVar17 = 0;
    dVar15 = 0.0;
    dVar16 = 0.0;
LAB_0010fcbb:
    do {
      pvVar3 = local_90;
      pvVar2 = local_98;
      uVar6 = (ulong)(uVar10 & 1);
      dVar1 = *input;
      *(double *)((long)local_90 + uVar17 * 8) = dVar1;
      uVar11 = (ulong)dVar1 ^ (ulong)dVar15;
      *(long *)((long)local_98 + uVar14 * 8) = (long)dVar1 - (long)dVar16;
      uVar12 = (ulong)((uVar10 & 1) << 3);
      *(ulong *)((long)local_58 + uVar12 + 0x10) = uVar11;
      uVar17 = (uVar17 << ((byte)local_a0 & 0x3f) ^ (ulong)dVar1 >> ((byte)local_78 & 0x3f)) &
               local_b0;
      uVar8 = lVar13 + (long)dVar16 ^ (ulong)dVar1;
      *(ulong *)((long)local_58 + uVar12) = uVar8;
      uVar14 = (uVar14 << ((byte)local_68 & 0x3f) ^
               (ulong)((long)dVar1 - (long)dVar16) >> ((byte)local_70 & 0x3f)) & local_a8;
      *(undefined8 *)((long)auStack_d8 + uVar12) = 8;
      lVar13 = *(long *)((long)pvVar2 + uVar14 * 8);
      bVar18 = dVar1 == dVar15;
      dVar15 = *(double *)((long)pvVar3 + uVar17 * 8);
      if (bVar18) {
        uVar9 = 0;
LAB_0010fd7e:
        auStack_d8[uVar6] = uVar9;
      }
      else {
        uVar9 = 1;
        if (uVar11 < 0x100) goto LAB_0010fd7e;
        if (uVar11 < 0x10000) {
          uVar9 = 2;
          if (uVar8 < 0x100) {
            uVar9 = 9;
          }
          goto LAB_0010fd7e;
        }
        if (0xffffff < uVar11) {
          if (uVar11 >> 0x20 == 0) {
            auStack_d8[uVar6] = 4;
            uVar9 = 9;
            if (((0xff < uVar8) && (uVar9 = 10, 0xffff < uVar8)) && (uVar9 = 0xb, 0xffffff < uVar8))
            goto LAB_0010fd82;
          }
          else if (uVar11 >> 0x28 == 0) {
            auStack_d8[uVar6] = 5;
            uVar9 = 9;
            if (((0xff < uVar8) && (uVar9 = 10, 0xffff < uVar8)) &&
               ((uVar9 = 0xb, 0xffffff < uVar8 && (uVar9 = 0xc, uVar8 >> 0x20 != 0))))
            goto LAB_0010fd82;
          }
          else if (uVar11 >> 0x30 == 0) {
            auStack_d8[uVar6] = 6;
            uVar9 = 9;
            if ((((0xff < uVar8) && (uVar9 = 10, 0xffff < uVar8)) && (uVar9 = 0xb, 0xffffff < uVar8)
                ) && (uVar9 = 0xc, uVar8 >> 0x20 != 0)) {
              uVar9 = 0xd;
              uVar12 = 0x10000000000;
              goto LAB_0010ff42;
            }
          }
          else if (uVar11 >> 0x38 == 0) {
            auStack_d8[uVar6] = 7;
            uVar9 = 9;
            if (((0xff < uVar8) && (uVar9 = 10, 0xffff < uVar8)) &&
               ((uVar9 = 0xb, 0xffffff < uVar8 &&
                ((uVar9 = 0xc, uVar8 >> 0x20 != 0 && (uVar9 = 0xd, 0xffffffffff < uVar8)))))) {
              uVar9 = 0xe;
              uVar12 = 0x1000000000000;
LAB_0010ff42:
              if (uVar12 <= uVar8) goto LAB_0010fd82;
            }
          }
          else {
            uVar9 = 9;
            if (((((0xff < uVar8) && (uVar9 = 10, 0xffff < uVar8)) &&
                 (uVar9 = 0xb, 0xffffff < uVar8)) &&
                ((uVar9 = 0xc, uVar8 >> 0x20 != 0 && (uVar9 = 0xd, 0xffffffffff < uVar8)))) &&
               (uVar9 = 0xe, 0xffffffffffff < uVar8)) {
              uVar9 = 0xf;
              uVar12 = 0x100000000000000;
              goto LAB_0010ff42;
            }
          }
          goto LAB_0010fd7e;
        }
        auStack_d8[uVar6] = 3;
        uVar9 = 9;
        if ((uVar8 < 0x100) || (uVar9 = 10, uVar8 < 0x10000)) goto LAB_0010fd7e;
      }
LAB_0010fd82:
      input = input + 1;
      dVar16 = dVar1;
      if (uVar6 == 0) {
        uVar10 = uVar10 | 1;
        if (uVar10 == (uint)local_b8) goto LAB_0011005e;
        goto LAB_0010fcbb;
      }
      local_60 = dVar15;
      trico_fill_code_double(&local_c0,local_58 + 2,local_58,auStack_d8);
      uVar10 = uVar10 + 1;
      dVar15 = local_60;
    } while (uVar10 != (uint)local_b8);
  }
  ppuVar4 = local_80;
  puVar7 = *local_80;
  uVar10 = (int)local_c0 - (int)puVar7;
  *local_88 = uVar10;
  free(local_90);
  free(local_98);
  puVar7 = (uint8_t *)realloc(puVar7,(ulong)uVar10);
  *ppuVar4 = puVar7;
  return;
}

Assistant:

void trico_compress_double_precision(uint32_t* nr_of_compressed_bytes, uint8_t** out, const double* input, const uint32_t number_of_doubles, uint64_t hash1_size_exponent, uint64_t hash2_size_exponent)
  {
  hash1_size_exponent = (hash1_size_exponent >> 1) << 1;
  hash2_size_exponent = (hash2_size_exponent >> 1) << 1;
  if (hash1_size_exponent > 30)
    hash1_size_exponent = 30;
  if (hash2_size_exponent > 30)
    hash2_size_exponent = 30;

  uint32_t max_size = (number_of_doubles) * sizeof(double) + (number_of_doubles) / 2 + (number_of_doubles & 1); // theoretical maximum
  *out = (uint8_t*)trico_malloc(max_size);

  const uint64_t hash1_size = (uint64_t)1 << hash1_size_exponent;
  const uint64_t hash2_size = (uint64_t)1 << hash2_size_exponent;
  const uint64_t hash1_mask = hash1_size - 1;
  const uint64_t hash2_mask = hash2_size - 1;

  uint64_t* hash_table_1 = (uint64_t*)trico_calloc(hash1_size, 8);
  uint64_t* hash_table_2 = (uint64_t*)trico_calloc(hash2_size, 8);

  uint64_t value;
  uint64_t stride;
  uint64_t last_value = 0;
  uint64_t hash1 = 0;
  uint64_t hash2 = 0;
  uint64_t prediction1 = 0;
  uint64_t prediction2 = 0;
  uint64_t xor1[2];
  uint64_t xor2[2];
  uint64_t bcode[2];
  uint32_t j = 0;
  uint8_t* p_out = *out;

  uint8_t hash_info = (uint8_t)(((hash1_size_exponent >> 1) << 4) | (hash2_size_exponent >> 1));
  *p_out++ = hash_info;

  *p_out++ = (uint8_t)((number_of_doubles >> 24));
  *p_out++ = (uint8_t)((number_of_doubles >> 16) & 0xff);
  *p_out++ = (uint8_t)((number_of_doubles >> 8) & 0xff);
  *p_out++ = (uint8_t)((number_of_doubles) & 0xff);

  for (uint32_t i = 0; i < number_of_doubles; ++i)
    {
    j = i & 1;
    value = *(const uint64_t*)(input++);

    xor1[j] = value ^ prediction1;
    hash_table_1[hash1] = value;
    hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
    prediction1 = hash_table_1[hash1];

    stride = value - last_value;
    xor2[j] = value ^ (last_value + prediction2);
    last_value = value;
    hash_table_2[hash2] = stride;
    hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
    prediction2 = hash_table_2[hash2];


    bcode[j] = 8; // 8 bytes
    if (0 == xor1[j])
      {
      bcode[j] = 0; // 0 bytes
      }
    else if (0 == (xor1[j] >> 8))
      {
      bcode[j] = 1; // 1 byte
      }
    else if (0 == (xor1[j] >> 16))
      {
      bcode[j] = 2; // 2 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      }
    else if (0 == (xor1[j] >> 24))
      {
      bcode[j] = 3; // 3 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      }
    else if (0 == (xor1[j] >> 32))
      {
      bcode[j] = 4; // 4 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      }
    else if (0 == (xor1[j] >> 40))
      {
      bcode[j] = 5; // 5 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      }
    else if (0 == (xor1[j] >> 48))
      {
      bcode[j] = 6; // 6 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      }
    else if (0 == (xor1[j] >> 56))
      {
      bcode[j] = 7; // 7 bytes
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      else if (0 == (xor2[j] >> 48))
        {
        bcode[j] = 14; // 6 bytes
        }
      }
    else // 8 bytes
      {
      if (0 == (xor2[j] >> 8))
        {
        bcode[j] = 9; // 1 byte
        }
      else if (0 == (xor2[j] >> 16))
        {
        bcode[j] = 10; // 2 bytes
        }
      else if (0 == (xor2[j] >> 24))
        {
        bcode[j] = 11; // 3 bytes
        }
      else if (0 == (xor2[j] >> 32))
        {
        bcode[j] = 12; // 4 bytes
        }
      else if (0 == (xor2[j] >> 40))
        {
        bcode[j] = 13; // 5 bytes
        }
      else if (0 == (xor2[j] >> 48))
        {
        bcode[j] = 14; // 6 bytes
        }
      else if (0 == (xor2[j] >> 56))
        {
        bcode[j] = 15; // 7 bytes
        }
      }

    if (j == 1)
      {
      trico_fill_code_double(&p_out, xor1, xor2, bcode);
      }
    }
  if (j == 0)
    {
    bcode[1] = 1;
    xor1[1] = 0;
    trico_fill_code_double(&p_out, xor1, xor2, bcode);
    }

  *nr_of_compressed_bytes = (uint32_t)(p_out - *out);
  trico_free(hash_table_1);
  trico_free(hash_table_2);
  *out = (uint8_t*)trico_realloc(*out, *nr_of_compressed_bytes);
  }